

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

size_t * __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
::shapeEnd(BinaryViewExpressionScalarSecond<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
           *this)

{
  size_t *psVar1;
  BinaryViewExpressionScalarSecond<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *this_local;
  
  psVar1 = View<int,_true,_std::allocator<unsigned_long>_>::shapeEnd(this->e_);
  return psVar1;
}

Assistant:

const std::size_t* shapeEnd() const 
        { return e_.shapeEnd(); }